

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBlob.h
# Opt level: O0

STBlob * __thiscall jbcoin::STBlob::operator=(STBlob *this,Slice *slice)

{
  uint8_t *data;
  size_t size;
  Buffer local_28;
  Slice *local_18;
  Slice *slice_local;
  STBlob *this_local;
  
  local_18 = slice;
  slice_local = (Slice *)this;
  data = Slice::data(slice);
  size = Slice::size(local_18);
  Buffer::Buffer(&local_28,data,size);
  Buffer::operator=(&this->value_,&local_28);
  Buffer::~Buffer(&local_28);
  return this;
}

Assistant:

STBlob&
    operator= (Slice const& slice)
    {
        value_ = Buffer(slice.data(), slice.size());
        return *this;
    }